

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# invalid_locale_ctype_tests.cpp
# Opt level: O3

void __thiscall iu_Locale_x_iutest_x_Invalid_Test::Body(iu_Locale_x_iutest_x_Invalid_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  AssertionResult iutest_ar;
  char *in_stack_fffffffffffffdf8;
  char *in_stack_fffffffffffffe00;
  AssertionResult local_1f8;
  AssertionHelper local_1d0;
  undefined1 local_1a0 [128];
  ios_base local_120 [264];
  
  setlocale(0,"xxx");
  iutest::internal::NullHelper<false>::CompareEq<char>
            (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
  bVar2 = local_1f8.m_result;
  if (local_1f8.m_result == false) {
    memset((iu_global_format_stringstream *)local_1a0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1a0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1d0,local_1f8.m_message._M_dataplus._M_p,
               (allocator<char> *)&stack0xfffffffffffffe07);
    local_1d0.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/invalid_locale_ctype_tests.cpp"
    ;
    local_1d0.m_part_result.super_iuCodeMessage.m_line = 0x19;
    local_1d0.m_part_result.super_iuCodeMessage._44_4_ = 0xfffffffd;
    iutest::AssertionHelper::OnFixed(&local_1d0,(Fixed *)local_1a0,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_1d0.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete(local_1d0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_1d0.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1a0);
    std::ios_base::~ios_base(local_120);
  }
  paVar1 = &local_1f8.m_message.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8.m_message._M_dataplus._M_p != paVar1) {
    operator_delete(local_1f8.m_message._M_dataplus._M_p,
                    local_1f8.m_message.field_2._M_allocated_capacity + 1);
  }
  if (bVar2 != false) {
    iutest::detail::IUStreamCapture::GetStreamString_abi_cxx11_
              ((string *)local_1a0,(IUStreamCapture *)&stderr_capture);
    iuutil::StrInHelper::Assertion<char[35],std::__cxx11::string>
              (&local_1f8,(StrInHelper *)"\"failed: setlocale LC_CTYPE to hoge\"",
               "stderr_capture.GetStreamString()","failed: setlocale LC_CTYPE to hoge",
               (char (*) [35])local_1a0,in_R9);
    if ((undefined1 *)local_1a0._0_8_ != local_1a0 + 0x10) {
      operator_delete((void *)local_1a0._0_8_,local_1a0._16_8_ + 1);
    }
    if (local_1f8.m_result == false) {
      memset((iu_global_format_stringstream *)local_1a0,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)local_1a0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1d0,local_1f8.m_message._M_dataplus._M_p,
                 (allocator<char> *)&stack0xfffffffffffffe07);
      local_1d0.m_part_result.super_iuCodeMessage.m_file =
           "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/invalid_locale_ctype_tests.cpp"
      ;
      local_1d0.m_part_result.super_iuCodeMessage.m_line = 0x1a;
      local_1d0.m_part_result.super_iuCodeMessage._44_4_ = 2;
      iutest::AssertionHelper::OnFixed(&local_1d0,(Fixed *)local_1a0,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
          &local_1d0.m_part_result.super_iuCodeMessage.m_message.field_2) {
        operator_delete(local_1d0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                        local_1d0.m_part_result.super_iuCodeMessage.m_message.field_2.
                        _M_allocated_capacity + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1a0);
      std::ios_base::~ios_base(local_120);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8.m_message._M_dataplus._M_p != paVar1) {
      operator_delete(local_1f8.m_message._M_dataplus._M_p,
                      local_1f8.m_message.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

IUTEST(Locale, Invalid)
{
    IUTEST_ASSUME_NULL(setlocale(LC_CTYPE, "xxx"));
    IUTEST_ASSERT_STRIN("failed: setlocale LC_CTYPE to hoge", stderr_capture.GetStreamString());
}